

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,string *v)

{
  char *buf;
  size_t len;
  string *v_local;
  LogStream *this_local;
  
  buf = (char *)std::__cxx11::string::c_str();
  len = std::__cxx11::string::size();
  detail::FixedBuffer<4000>::append(&this->m_buffer,buf,len);
  return this;
}

Assistant:

LogStream& operator<<(const std::string& v){
		m_buffer.append(v.c_str(), v.size());

		return *this;
	}